

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O1

bool __thiscall IMLE::save(IMLE *this,string *filename)

{
  char cVar1;
  basic_oserializer *pbVar2;
  text_oarchive archive;
  ofstream fs;
  text_oarchive local_2a0;
  ostream local_218 [512];
  
  std::ofstream::ofstream(local_218,(filename->_M_dataplus)._M_p,_S_out);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2a0,
                   "IMLE: Could not open file ",filename);
    message(this,(string *)&local_2a0);
    if ((undefined1 *)local_2a0._0_8_ != &local_2a0.field_0x10) {
      operator_delete((void *)local_2a0._0_8_);
    }
  }
  else {
    boost::archive::text_oarchive::text_oarchive(&local_2a0,local_218,0);
    pbVar2 = &boost::serialization::
              singleton<boost::archive::detail::oserializer<boost::archive::text_oarchive,_IMLE>_>::
              get_instance()->super_basic_oserializer;
    boost::archive::detail::basic_oarchive::save_object((basic_oarchive *)&local_2a0,this,pbVar2);
    std::ofstream::close();
    boost::archive::text_oarchive_impl<boost::archive::text_oarchive>::~text_oarchive_impl
              (&local_2a0.super_text_oarchive_impl<boost::archive::text_oarchive>);
  }
  std::ofstream::~ofstream(local_218);
  return (bool)cVar1;
}

Assistant:

IMLE_CLASS_TEMPLATE
bool IMLE_base::save(std::string const &filename)
{
    std::ofstream fs(filename.c_str());

	if( !fs.is_open() )
	{
		message(OPENERR + filename);
		return false;
	}
    boost::archive::text_oarchive archive(fs);

	archive & (*this);
    fs.close();

    return true;
}